

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void __thiscall DPusher::Tick(DPusher *this)

{
  double *pdVar1;
  double dVar2;
  msecnode_t *pmVar3;
  double dVar4;
  DObject *pDVar5;
  bool bVar6;
  sector_t *psVar7;
  undefined4 extraout_var;
  int iVar8;
  AActor *pAVar9;
  DObject *pDVar10;
  AActor *t2;
  sector_t *this_00;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  DVector2 pos;
  FPortalGroupArray check;
  CheckResult cres;
  FMultiBlockThingsIterator it;
  undefined1 local_248 [32];
  DAngle local_228;
  undefined1 local_220 [40];
  CheckResult local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  if ((var_pushers.Value) && ((sectors[this->m_Affectee].Flags & 0x20) != 0)) {
    if (this->m_Type == p_push) {
      local_220._24_8_ = (AActor **)0x0;
      local_220._32_8_ = 0.0;
      local_220._4_4_ = 0;
      local_220[0x10] = '\0';
      local_220[0] = false;
      pAVar9 = (this->m_Source).field_0.p;
      if ((pAVar9 != (AActor *)0x0) &&
         (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->m_Source).field_0.p = (AActor *)0x0;
        pAVar9 = (AActor *)0x0;
      }
      FMultiBlockThingsIterator::FMultiBlockThingsIterator
                (&local_1d0,(FPortalGroupArray *)local_220,pAVar9,this->m_Radius,false);
LAB_00530420:
      bVar6 = FMultiBlockThingsIterator::Next(&local_1d0,&local_1f8);
      pAVar9 = local_1f8.thing;
      if (bVar6) {
        if ((((local_1f8.thing)->flags2).Value & 2) == 0) {
          bVar6 = false;
        }
        else {
          bVar6 = (((local_1f8.thing)->flags).Value & 0x1000) == 0;
        }
        if ((compatflags.Value._3_1_ & 1) != 0) goto code_r0x00530458;
        goto LAB_00530487;
      }
      TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                (&local_1d0.blockIterator.DynHash);
      TArray<unsigned_short,_unsigned_short>::~TArray
                ((TArray<unsigned_short,_unsigned_short> *)(local_220 + 0x18));
    }
    else {
      this_00 = sectors + this->m_Affectee;
      for (pmVar3 = this_00->touching_thinglist; pmVar3 != (msecnode_t *)0x0;
          pmVar3 = pmVar3->m_snext) {
        pAVar9 = pmVar3->m_thing;
        if ((((pAVar9->flags2).Value & 2) != 0) && (((pAVar9->flags).Value & 0x1000) == 0)) {
          psVar7 = sector_t::GetHeightSec(this_00);
          iVar8 = pAVar9->Sector->PortalGroup;
          dVar13 = 0.0;
          uVar11 = 0;
          uVar12 = 0;
          if (iVar8 != this_00->PortalGroup) {
            iVar8 = this_00->PortalGroup * Displacements.size + iVar8;
            dVar13 = Displacements.data.Array[iVar8].pos.X;
            dVar2 = Displacements.data.Array[iVar8].pos.Y;
            uVar11 = SUB84(dVar2,0);
            uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
          }
          dVar13 = dVar13 + (pAVar9->__Pos).X;
          dVar2 = (double)CONCAT44(uVar12,uVar11) + (pAVar9->__Pos).Y;
          if (this->m_Type == p_wind) {
            if (psVar7 == (sector_t *)0x0) {
              dVar13 = (pAVar9->__Pos).Z;
              if (pAVar9->floorz <= dVar13 && dVar13 != pAVar9->floorz) goto LAB_0053035a;
            }
            else {
              dVar13 = (dVar2 * (psVar7->floorplane).normal.Y +
                       dVar13 * (psVar7->floorplane).normal.X + (psVar7->floorplane).D) *
                       (psVar7->floorplane).negiC;
              if (dVar13 < (pAVar9->__Pos).Z) {
LAB_0053035a:
                dVar4 = (this->m_PushVec).X;
                dVar14 = (this->m_PushVec).Y;
                goto LAB_00530380;
              }
              dVar14 = 0.0;
              pdVar1 = &pAVar9->player->viewz;
              dVar4 = 0.0;
              if (*pdVar1 <= dVar13 && dVar13 != *pdVar1) goto LAB_00530380;
            }
            dVar4 = (this->m_PushVec).X * 0.5;
            dVar14 = (this->m_PushVec).Y * 0.5;
          }
          else {
            if (psVar7 == (sector_t *)0x0) {
              psVar7 = this_00;
            }
            dVar14 = 0.0;
            dVar4 = 0.0;
            if ((pAVar9->__Pos).Z <=
                (dVar2 * (psVar7->floorplane).normal.Y +
                dVar13 * (psVar7->floorplane).normal.X + (psVar7->floorplane).D) *
                (psVar7->floorplane).negiC) goto LAB_0053035a;
          }
LAB_00530380:
          (pAVar9->Vel).X = dVar4 * 0.0078125 + (pAVar9->Vel).X;
          (pAVar9->Vel).Y = dVar14 * 0.0078125 + (pAVar9->Vel).Y;
        }
      }
    }
  }
  return;
code_r0x00530458:
  if (((bVar6) || (bVar6 = AActor::IsSentient(local_1f8.thing), bVar6)) ||
     (((pAVar9->flags).Value & 4) != 0)) {
    if (pAVar9->player != (player_t *)0x0) {
      bVar6 = ((pAVar9->flags).Value & 0x200) == 0;
LAB_00530487:
      if (!bVar6) goto LAB_00530420;
    }
    AActor::Vec2To((AActor *)local_248,(this->m_Source).field_0.p);
    dVar13 = c_sqrt((double)local_248._8_8_ * (double)local_248._8_8_ +
                    (double)local_248._0_8_ * (double)local_248._0_8_);
    local_248._24_8_ = (dVar13 * -0.5 + this->m_Magnitude) * 0.00390625;
    if (0.0 < (double)local_248._24_8_) {
      t2 = (this->m_Source).field_0.p;
      if ((t2 != (AActor *)0x0) && (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->m_Source).field_0.p = (AActor *)0x0;
        t2 = (AActor *)0x0;
      }
      bVar6 = P_CheckSight(pAVar9,t2,1);
      if (bVar6) {
        dVar13 = c_atan2((double)local_248._8_8_,(double)local_248._0_8_);
        pDVar10 = (this->m_Source).field_0.o;
        if ((pDVar10 != (DObject *)0x0) && ((pDVar10->ObjectFlags & 0x20) != 0)) {
          (this->m_Source).field_0.p = (AActor *)0x0;
          pDVar10 = (DObject *)0x0;
        }
        pDVar5 = (DObject *)(dVar13 * 57.29577951308232);
        if (pDVar10->Class == (PClass *)0x0) {
          local_248._16_8_ = (DObject *)(dVar13 * 57.29577951308232);
          iVar8 = (**pDVar10->_vptr_DObject)(pDVar10);
          pDVar10->Class = (PClass *)CONCAT44(extraout_var,iVar8);
          pDVar5 = (DObject *)local_248._16_8_;
        }
        local_228.Degrees = (double)((double)pDVar5 + 180.0);
        if ((pDVar10->Class->super_PStruct).super_PNamedType.TypeName.Index != 0x3d) {
          local_228.Degrees = (double)pDVar5;
        }
        AActor::Thrust(pAVar9,&local_228,(double)local_248._24_8_);
      }
    }
  }
  goto LAB_00530420;
}

Assistant:

void DPusher::Tick ()
{
	sector_t *sec;
	AActor *thing;
	msecnode_t *node;
	double ht;

	if (!var_pushers)
		return;

	sec = sectors + m_Affectee;

	// Be sure the special sector type is still turned on. If so, proceed.
	// Else, bail out; the sector type has been changed on us.

	if (!(sec->Flags & SECF_PUSH))
		return;

	// For constant pushers (wind/current) there are 3 situations:
	//
	// 1) Affected Thing is above the floor.
	//
	//    Apply the full force if wind, no force if current.
	//
	// 2) Affected Thing is on the ground.
	//
	//    Apply half force if wind, full force if current.
	//
	// 3) Affected Thing is below the ground (underwater effect).
	//
	//    Apply no force if wind, full force if current.
	//
	// Apply the effect to clipped players only for now.
	//
	// In Phase II, you can apply these effects to Things other than players.
	// [RH] No Phase II, but it works with anything having MF2_WINDTHRUST now.

	if (m_Type == p_push)
	{
		// Seek out all pushable things within the force radius of this
		// point pusher. Crosses sectors, so use blockmap.

		FPortalGroupArray check(FPortalGroupArray::PGA_NoSectorPortals);	// no sector portals because this thing is utterly z-unaware.
		FMultiBlockThingsIterator it(check, m_Source, m_Radius);
		FMultiBlockThingsIterator::CheckResult cres;


		while (it.Next(&cres))
		{
			AActor *thing = cres.thing;
			// Normal ZDoom is based only on the WINDTHRUST flag, with the noclip cheat as an exemption.
			bool pusharound = ((thing->flags2 & MF2_WINDTHRUST) && !(thing->flags & MF_NOCLIP));
					
			// MBF allows any sentient or shootable thing to be affected, but players with a fly cheat aren't.
			if (compatflags & COMPATF_MBFMONSTERMOVE)
			{
				pusharound = ((pusharound || (thing->IsSentient()) || (thing->flags & MF_SHOOTABLE)) // Add categories here
					&& (!(thing->player && (thing->flags & (MF_NOGRAVITY))))); // Exclude flying players here
			}

			if ((pusharound) )
			{
				DVector2 pos = m_Source->Vec2To(thing);
				double dist = pos.Length();
				double speed = (m_Magnitude - (dist/2)) / (PUSH_FACTOR * 2);

				// If speed <= 0, you're outside the effective radius. You also have
				// to be able to see the push/pull source point.

				if ((speed > 0) && (P_CheckSight (thing, m_Source, SF_IGNOREVISIBILITY)))
				{
					DAngle pushangle = pos.Angle();
					if (m_Source->GetClass()->TypeName == NAME_PointPuller) pushangle += 180;  
					thing->Thrust(pushangle, speed);
				}
			}
		}
		return;
	}

	// constant pushers p_wind and p_current

	node = sec->touching_thinglist; // things touching this sector
	for ( ; node ; node = node->m_snext)
	{
		thing = node->m_thing;
		if (!(thing->flags2 & MF2_WINDTHRUST) || (thing->flags & MF_NOCLIP))
			continue;

		sector_t *hsec = sec->GetHeightSec();
		DVector3 pos = thing->PosRelative(sec);
		DVector2 pushvel;
		if (m_Type == p_wind)
		{
			if (hsec == NULL)
			{ // NOT special water sector
				if (thing->Z() > thing->floorz) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else // on ground
				{
					pushvel = m_PushVec / 2; // half force
				}
			}
			else // special water sector
			{
				ht = hsec->floorplane.ZatPoint(pos);
				if (thing->Z() > ht) // above ground
				{
					pushvel = m_PushVec; // full force
				}
				else if (thing->player->viewz < ht) // underwater
				{
					pushvel.Zero(); // no force
				}
				else // wading in water
				{
					pushvel = m_PushVec / 2; // full force
				}
			}
		}
		else // p_current
		{
			const secplane_t *floor;

			if (hsec == NULL)
			{ // NOT special water sector
				floor = &sec->floorplane;
			}
			else
			{ // special water sector
				floor = &hsec->floorplane;
			}
			if (thing->Z() > floor->ZatPoint(pos))
			{ // above ground
				pushvel.Zero(); // no force
			}
			else
			{ // on ground/underwater
				pushvel = m_PushVec; // full force
			}
		}
		thing->Vel += pushvel / PUSH_FACTOR;
	}
}